

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

Vec_Int_t * Gia_ManCollectPoIds(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  int local_20;
  int i;
  int Entry;
  Vec_Int_t *vStart;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManPoNum(p);
  p_00 = Vec_IntAlloc(iVar1);
  for (local_20 = 0; iVar1 = Gia_ManPoNum(p), local_20 < iVar1; local_20 = local_20 + 1) {
    iVar1 = Vec_IntEntry(p->vCos,local_20);
    Vec_IntPush(p_00,iVar1);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManCollectPoIds( Gia_Man_t * p )
{
    Vec_Int_t * vStart;
    int Entry, i;
    vStart = Vec_IntAlloc( Gia_ManPoNum(p) );
    Vec_IntForEachEntryStop( p->vCos, Entry, i, Gia_ManPoNum(p) )
        Vec_IntPush( vStart, Entry );
    return vStart;
}